

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HSimplexNla::debugReportInvertSolutionError
          (HSimplexNla *this,string *source,bool transposed,double solve_error_norm,
          double residual_error_norm,bool force)

{
  HighsDebugStatus HVar1;
  uint uVar2;
  HighsLogType HVar6;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  HighsLogOptions *in_XMM0_Qa;
  HighsLogOptions *in_XMM1_Qa;
  string type;
  HighsDebugStatus return_status;
  HighsLogType report_level;
  string value_adjective;
  HighsOptions *options;
  allocator local_81;
  string local_80 [32];
  HighsDebugStatus local_60;
  uint local_5c;
  string local_58 [32];
  long local_38;
  byte local_29;
  HighsLogOptions *local_28;
  HighsLogOptions *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_29 = in_CL & 1;
  local_38 = *(long *)(in_RDI + 0x18);
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  std::__cxx11::string::string(local_58);
  local_60 = kOk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  if ((local_11 & 1) != 0) {
    std::__cxx11::string::operator=(local_80,"transposed ");
  }
  if (((double)local_20 != 0.0) || (NAN((double)local_20))) {
    if ((double)local_20 <= kSolveExcessiveError) {
      if ((double)local_20 <= 1e-08) {
        std::__cxx11::string::operator=(local_58,"Small");
        local_5c = 1;
      }
      else {
        std::__cxx11::string::operator=(local_58,"Large");
        local_5c = 4;
      }
    }
    else {
      std::__cxx11::string::operator=(local_58,"Excessive");
      local_5c = 5;
    }
    if ((local_29 & 1) != 0) {
      local_5c = 1;
    }
    uVar2 = local_5c;
    _HVar6 = (HighsLogType)(local_38 + 0x380);
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    highsLogDev(local_20,_HVar6,(char *)(ulong)uVar2,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s solve error\n",uVar3,uVar4,uVar5);
  }
  if (((double)local_28 != 0.0) || (NAN((double)local_28))) {
    if ((double)local_28 <= kResidualExcessiveError) {
      if ((double)local_28 <= 1e-08) {
        std::__cxx11::string::operator=(local_58,"Small");
        local_5c = 1;
      }
      else {
        std::__cxx11::string::operator=(local_58,"Large");
        local_5c = 4;
        local_60 = kWarning;
      }
    }
    else {
      std::__cxx11::string::operator=(local_58,"Excessive");
      local_5c = 5;
      local_60 = kError;
    }
    if ((local_29 & 1) != 0) {
      local_5c = 1;
    }
    uVar2 = local_5c;
    _HVar6 = (HighsLogType)(local_38 + 0x380);
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    highsLogDev(local_28,_HVar6,(char *)(ulong)uVar2,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s residual error\n",uVar3,uVar4,uVar5);
  }
  HVar1 = local_60;
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_58);
  return HVar1;
}

Assistant:

HighsDebugStatus HSimplexNla::debugReportInvertSolutionError(
    const std::string source, const bool transposed,
    const double solve_error_norm, const double residual_error_norm,
    const bool force) const {
  const HighsOptions* options = this->options_;
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  std::string type = "";
  if (transposed) type = "transposed ";
  if (solve_error_norm) {
    if (solve_error_norm > kSolveExcessiveError) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
    } else if (solve_error_norm > kSolveLargeError) {
      value_adjective = "Large";
      report_level = HighsLogType::kWarning;
    } else {
      value_adjective = "Small";
      report_level = HighsLogType::kInfo;
    }
    if (force) report_level = HighsLogType::kInfo;
    //    printf("%s\n", value_adjective.c_str());
    //    printf("%g\n", solve_error_norm);
    //    printf("%s\n", type.c_str());
    //    printf("%s\n", source.c_str());
    highsLogDev(options->log_options, report_level,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s solve error\n",
                value_adjective.c_str(), solve_error_norm, type.c_str(),
                source.c_str());
  }

  if (residual_error_norm) {
    if (residual_error_norm > kResidualExcessiveError) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (residual_error_norm > kResidualLargeError) {
      value_adjective = "Large";
      report_level = HighsLogType::kWarning;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "Small";
      report_level = HighsLogType::kInfo;
    }
    if (force) report_level = HighsLogType::kInfo;
    highsLogDev(options->log_options, report_level,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s "
                "residual error\n",
                value_adjective.c_str(), residual_error_norm, type.c_str(),
                source.c_str());
  }
  return return_status;
}